

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugContext.cpp
# Opt level: O3

void __thiscall Js::DebugContext::SetDebuggerMode(DebugContext *this,DebuggerMode mode)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->debuggerMode != mode) {
    if (mode == NotDebugging) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugContext.cpp"
                                  ,0x9d,"(false)","Transitioning to non-debug mode is not allowed.")
      ;
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    else {
      this->debuggerMode = mode;
    }
  }
  return;
}

Assistant:

void DebugContext::SetDebuggerMode(DebuggerMode mode)
    {
        if (this->debuggerMode == mode)
        {
            // Already in this mode so return.
            return;
        }

        if (mode == DebuggerMode::NotDebugging)
        {
            AssertMsg(false, "Transitioning to non-debug mode is not allowed.");
            return;
        }

        this->debuggerMode = mode;
    }